

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v9::vprint(FILE *f,string_view format_str,format_args args)

{
  size_t sVar1;
  string_view text;
  memory_buffer buffer;
  undefined1 local_220 [536];
  
  local_220._8_8_ = local_220 + 0x20;
  local_220._16_8_ = (char *)0x0;
  local_220._0_8_ = &PTR_grow_002706e0;
  local_220._24_8_ = 500;
  sVar1 = args.desc_;
  detail::vformat_to<char>((buffer<char> *)local_220,format_str,args,(locale_ref)0x0);
  text.size_ = sVar1;
  text.data_ = (char *)local_220._16_8_;
  detail::print((detail *)f,(FILE *)local_220._8_8_,text);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_220);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  detail::print(f, {buffer.data(), buffer.size()});
}